

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O3

size_type __thiscall
google::protobuf::stringpiece_internal::StringPiece::find_first_of
          (StringPiece *this,StringPiece s,size_type pos)

{
  ulong uVar1;
  char *pcVar2;
  size_type sVar3;
  void *pvVar4;
  size_type sVar5;
  size_type i_1;
  size_type i;
  char *data;
  size_type length;
  bool lookup [256];
  char acStack_138 [264];
  
  sVar5 = s.length_;
  uVar1 = this->length_;
  sVar3 = 0xffffffffffffffff;
  if (sVar5 != 0 && uVar1 != 0) {
    if (sVar5 == 1) {
      if (pos <= uVar1 && uVar1 - pos != 0) {
        pcVar2 = this->ptr_;
        pvVar4 = memchr(pcVar2 + pos,(int)*s.ptr_,uVar1 - pos);
        sVar3 = -(ulong)(pvVar4 == (void *)0x0) | (long)pvVar4 - (long)pcVar2;
      }
    }
    else {
      sVar3 = 0;
      memset(acStack_138,0,0x100);
      do {
        acStack_138[(byte)s.ptr_[sVar3]] = '\x01';
        sVar3 = sVar3 + 1;
      } while (sVar5 != sVar3);
      sVar3 = 0xffffffffffffffff;
      if (pos < uVar1) {
        do {
          if (acStack_138[(byte)this->ptr_[pos]] != '\0') {
            return pos;
          }
          pos = pos + 1;
        } while (uVar1 != pos);
      }
    }
  }
  return sVar3;
}

Assistant:

StringPiece::size_type StringPiece::find_first_of(StringPiece s,
                                                  size_type pos) const {
  if (empty() || s.empty()) {
    return npos;
  }
  // Avoid the cost of BuildLookupTable() for a single-character search.
  if (s.length_ == 1) return find_first_of(s.ptr_[0], pos);

  bool lookup[UCHAR_MAX + 1] = { false };
  BuildLookupTable(s, lookup);
  for (size_type i = pos; i < length_; ++i) {
    if (lookup[static_cast<unsigned char>(ptr_[i])]) {
      return i;
    }
  }
  return npos;
}